

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O1

Function * __thiscall
soul::StructuralParser::parseFunctionDeclaration
          (StructuralParser *this,Context *context,Expression *returnType,Identifier name,
          Context *nameLocation,
          vector<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
          *genericWildcards)

{
  undefined1 *newScope;
  Scope *pSVar1;
  SourceCodeText *pSVar2;
  SourceCodeText *o;
  DestructorFn *pDVar3;
  Allocator *pAVar4;
  Function *pFVar5;
  bool bVar6;
  int iVar7;
  Handle handle;
  IntrinsicType IVar8;
  PoolItem *pPVar9;
  Expression *pEVar10;
  undefined4 extraout_var;
  PoolItem *pPVar11;
  Identifier IVar12;
  Property *pPVar13;
  Block *pBVar14;
  pool_ref<soul::AST::UnqualifiedName> *w;
  DestructorFn *pDVar15;
  string_view s;
  string_view sVar16;
  Context typeLocation;
  Context local_118;
  Function *local_100;
  vector<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
  *local_f8;
  undefined1 local_f0 [32];
  Ptr local_d0;
  _Alloc_hider local_b8;
  pool_ptr<soul::AST::Expression> local_b0;
  pool_ptr<soul::AST::Function> local_a8;
  CompileMessage local_a0;
  CompileMessage local_68;
  
  local_f8 = genericWildcards;
  if (returnType->kind == type) {
    iVar7 = (*(returnType->super_Statement).super_ASTObject._vptr_ASTObject[3])(returnType);
    if ((char)iVar7 != '\0') {
      iVar7 = (*(returnType->super_Statement).super_ASTObject._vptr_ASTObject[10])(returnType);
      if (iVar7 == 0) {
        CompileMessageHelpers::createMessage<>
                  ((CompileMessage *)local_f0,syntax,error,"Function return type cannot be const");
        (*(this->super_SOULTokeniser)._vptr_Tokeniser[2])(this,(CompileMessage *)local_f0);
        RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_d0.object);
        if ((SourceCodeText *)local_f0._0_8_ != (SourceCodeText *)(local_f0 + 0x10)) {
          operator_delete((void *)local_f0._0_8_,(ulong)(local_f0._16_8_ + 1));
        }
      }
    }
  }
  pPVar9 = PoolAllocator::allocateSpaceForObject(&this->allocator->pool,0xe0);
  local_100 = (Function *)&pPVar9->item;
  AST::Function::Function(local_100,context);
  pPVar9->destructor =
       PoolAllocator::allocate<soul::AST::Function,_const_soul::AST::Context_&>::
       anon_class_1_0_00000001::__invoke;
  newScope = &pPVar9[1].field_0x18;
  pSVar1 = this->currentScope;
  this->currentScope = (Scope *)newScope;
  pPVar9[2].destructor = (DestructorFn *)name.name;
  pSVar2 = (nameLocation->location).sourceCode.object;
  if (pSVar2 != (SourceCodeText *)0x0) {
    (pSVar2->super_RefCountedObject).refCount = (pSVar2->super_RefCountedObject).refCount + 1;
  }
  o = (SourceCodeText *)pPVar9[2].item;
  pPVar9[2].item = pSVar2;
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(o);
  *(char **)&pPVar9[2].field_0x18 = (nameLocation->location).location.data;
  pPVar9[3].size = (size_t)nameLocation->parentScope;
  pPVar9[2].size = (size_t)returnType;
  std::
  vector<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
  ::_M_move_assign((vector<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
                    *)(pPVar9 + 4),local_f8);
  if ((Expression *)pPVar9[2].size != (Expression *)0x0) {
    recursivelyReplaceParentScope((Expression *)pPVar9[2].size,(Scope *)newScope);
  }
  pDVar3 = pPVar9[4].destructor;
  for (pDVar15 = (DestructorFn *)pPVar9[4].size; pDVar15 != pDVar3; pDVar15 = pDVar15 + 8) {
    recursivelyReplaceParentScope(*(Expression **)pDVar15,(Scope *)newScope);
  }
  bVar6 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2acfd0);
  if (!bVar6) {
    do {
      giveErrorOnExternalKeyword(this);
      local_f0._0_8_ = (this->super_SOULTokeniser).location.sourceCode.object;
      if ((SourceCodeText *)local_f0._0_8_ != (SourceCodeText *)0x0) {
        (((SourceCodeText *)local_f0._0_8_)->super_RefCountedObject).refCount =
             (((SourceCodeText *)local_f0._0_8_)->super_RefCountedObject).refCount + 1;
      }
      local_f0._8_8_ = (this->super_SOULTokeniser).location.location.data;
      local_f0._16_8_ = this->currentScope;
      pEVar10 = parseType(this,functionParameter);
      iVar7 = (*(pEVar10->super_Statement).super_ASTObject._vptr_ASTObject[0xb])(pEVar10);
      if ((CONCAT44(extraout_var,iVar7) != 0) && (*(int *)(CONCAT44(extraout_var,iVar7) + 4) == 1))
      {
        CompileMessageHelpers::createMessage<>
                  (&local_68,syntax,error,"Function parameters cannot be void");
        AST::Context::throwError((Context *)local_f0,&local_68,false);
      }
      if (0x3f8 < (ulong)((long)pPVar9[3].item - (long)pPVar9[3].destructor)) {
        CompileMessageHelpers::createMessage<>
                  (&local_a0,syntax,error,"Too many function parameters");
        AST::Context::throwError((Context *)local_f0,&local_a0,false);
      }
      local_118.location.sourceCode.object = (this->super_SOULTokeniser).location.sourceCode.object;
      if (local_118.location.sourceCode.object != (SourceCodeText *)0x0) {
        ((local_118.location.sourceCode.object)->super_RefCountedObject).refCount =
             ((local_118.location.sourceCode.object)->super_RefCountedObject).refCount + 1;
      }
      local_118.location.location.data = (this->super_SOULTokeniser).location.location.data;
      local_118.parentScope = this->currentScope;
      pPVar11 = PoolAllocator::allocateSpaceForObject(&this->allocator->pool,0x78);
      local_b8._M_p = (pointer)0x0;
      local_b0.object = pEVar10;
      AST::VariableDeclaration::VariableDeclaration
                ((VariableDeclaration *)&pPVar11->item,&local_118,&local_b0,
                 (pool_ptr<soul::AST::Expression> *)&local_b8,false);
      pPVar11->destructor =
           PoolAllocator::
           allocate<soul::AST::VariableDeclaration,_soul::AST::Context,_soul::AST::Expression_&,_std::nullptr_t,_bool>
           ::anon_class_1_0_00000001::__invoke;
      RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_118.location.sourceCode.object);
      local_118.location.sourceCode.object = (SourceCodeText *)&pPVar11->item;
      std::
      vector<soul::pool_ref<soul::AST::VariableDeclaration>,std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>>>
      ::emplace_back<soul::pool_ref<soul::AST::VariableDeclaration>>
                ((vector<soul::pool_ref<soul::AST::VariableDeclaration>,std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>>>
                  *)&pPVar9[3].destructor,(pool_ref<soul::AST::VariableDeclaration> *)&local_118);
      *(undefined1 *)&pPVar11[3].destructor = 1;
      IVar12 = parseIdentifier(this);
      *(string **)&pPVar11[1].field_0x18 = IVar12.name;
      bVar6 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
              ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2acfd0);
      if (!bVar6) {
        Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
        ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x289d49);
      }
      RefCountedPtr<soul::SourceCodeText>::decIfNotNull((SourceCodeText *)local_f0._0_8_);
    } while (!bVar6);
  }
  parseAnnotation(this,(Annotation *)(pPVar9 + 6));
  pPVar13 = AST::Annotation::findProperty<char[7]>
                      ((Annotation *)(pPVar9 + 6),(char (*) [7])"intrin");
  if (pPVar13 != (Property *)0x0) {
    (*(((pPVar13->value).object)->super_Statement).super_ASTObject._vptr_ASTObject[0xd])(local_f0);
    if (((SourceCodeText *)local_f0._0_8_ != (SourceCodeText *)0x0) &&
       ((char)*(size_type *)(local_f0._0_8_ + 0x30) == '\a')) {
      pAVar4 = this->allocator;
      handle = soul::Value::getStringLiteral((Value *)(local_f0._0_8_ + 0x30));
      sVar16 = StringDictionary::getStringForHandle(&pAVar4->stringDictionary,handle);
      s._M_str = sVar16._M_str;
      s._M_len = (size_t)s._M_str;
      IVar8 = getIntrinsicTypeFromName((soul *)sVar16._M_len,s);
      *(IntrinsicType *)&pPVar9[6].field_0x18 = IVar8;
      if (IVar8 == none) {
        throwInternalCompilerError
                  ("f.intrinsic != IntrinsicType::none","parseFunctionDeclaration",0x436);
      }
    }
  }
  bVar6 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2881d4);
  pFVar5 = local_100;
  if (!bVar6) {
    local_a8.object = local_100;
    pBVar14 = parseBracedBlock(this,&local_a8);
    pPVar9[7].size = (size_t)pBVar14;
  }
  this->currentScope = pSVar1;
  return pFVar5;
}

Assistant:

AST::Function& parseFunctionDeclaration (const AST::Context& context, AST::Expression& returnType,
                                             Identifier name, const AST::Context& nameLocation,
                                             std::vector<pool_ref<AST::UnqualifiedName>> genericWildcards)
    {
        if (AST::isResolvedAsType (returnType) && returnType.getConstness() == AST::Constness::definitelyConst)
            throwError (Errors::functionReturnTypeCannotBeConst());

        auto& f = allocate<AST::Function> (context);
        ScopedScope scope (*this, f);

        f.name = name;
        f.nameLocation = nameLocation;
        f.returnType = returnType;
        f.genericWildcards = std::move (genericWildcards);

        if (f.returnType != nullptr)
            recursivelyReplaceParentScope (*f.returnType, f);

        for (auto& w : f.genericWildcards)
            recursivelyReplaceParentScope (w, f);

        if (! matchIf (Operator::closeParen))
        {
            for (;;)
            {
                giveErrorOnExternalKeyword();
                auto typeLocation = getContext();
                auto& type = parseType (ParseTypeContext::functionParameter);

                if (auto t = type.getConcreteType())
                    if (t->isVoid())
                        typeLocation.throwError (Errors::parameterCannotBeVoid());

                if (f.parameters.size() > 127)
                    typeLocation.throwError (Errors::tooManyParameters());

                auto& v = allocate<AST::VariableDeclaration> (getContext(), type, nullptr, false);
                f.parameters.push_back (v);
                v.isFunctionParameter = true;
                v.name = parseIdentifier();

                if (matchIf (Operator::closeParen))
                    break;

                expect (Operator::comma);
            }
        }

        parseAnnotation (f.annotation);

        if (auto intrin = f.annotation.findProperty ("intrin"))
        {
            if (auto c = intrin->value->getAsConstant())
            {
                if (c->value.getType().isStringLiteral())
                {
                    f.intrinsic = getIntrinsicTypeFromName (allocator.stringDictionary.getStringForHandle (c->value.getStringLiteral()));
                    SOUL_ASSERT (f.intrinsic != IntrinsicType::none);
                }
            }
        }

        if (! matchIf (Operator::semicolon))
            f.block = parseBracedBlock (f);

        return f;
    }